

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Parms * __thiscall
embree::XMLLoader::loadMaterialParms
          (Parms *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *parms)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  XML *this_00;
  int iVar6;
  pointer pRVar7;
  runtime_error *this_01;
  long *plVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  char *pcVar11;
  XMLLoader *pXVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  Variant *data;
  Ref<embree::XML> entry;
  string name;
  string type;
  Ref<embree::XML> local_880;
  string local_878;
  undefined1 local_858 [32];
  string local_838;
  undefined1 local_818 [40];
  _Rb_tree_color local_7f0;
  undefined1 local_7e8 [8];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  undefined1 local_798 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  string local_738;
  Variant local_718;
  Variant local_6b0;
  Variant local_648;
  Variant local_5e0;
  Variant local_578;
  Variant local_510;
  Variant local_4a8;
  Variant local_440;
  Variant local_3d8;
  Variant local_370;
  Variant local_308;
  Variant local_2a0;
  Variant local_238;
  Variant local_1d0;
  Variant local_168;
  Variant local_100;
  Variant local_98;
  
  p_Var1 = &(__return_storage_ptr__->m)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pRVar7 = (parms->ptr->children).
           super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((parms->ptr->children).
      super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar7) {
    paVar9 = &local_510.str.field_2;
    paVar3 = &local_4a8.str.field_2;
    paVar4 = &local_6b0.str.field_2;
    uVar10 = 0;
    local_818._16_8_ = this;
    local_818._24_8_ = parms;
    do {
      this_00 = pRVar7[uVar10].ptr;
      local_880.ptr = this_00;
      if (this_00 != (XML *)0x0) {
        (*(this_00->super_RefCount)._vptr_RefCount[2])(this_00);
      }
      local_858._0_8_ = local_858 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"name","");
      XML::parm(&local_878,this_00,(string *)local_858);
      if ((undefined1 *)local_858._0_8_ != local_858 + 0x10) {
        operator_delete((void *)local_858._0_8_);
      }
      psVar2 = &this_00->name;
      pXVar12 = (XMLLoader *)psVar2;
      iVar6 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar6 == 0) {
        local_3d8.field_1.i[0] = load<int>(pXVar12,&local_880);
        local_3d8.type = INT1;
        local_3d8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_3d8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        paVar5 = &local_3d8.str.field_2;
        local_3d8.str._M_string_length = 0;
        local_3d8.str.field_2._M_local_buf[0] = '\0';
        local_3d8.str._M_dataplus._M_p = (pointer)paVar5;
        Parms::add(__return_storage_ptr__,&local_878,&local_3d8);
        this_02._M_pi =
             local_3d8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.str._M_dataplus._M_p != paVar5) {
          operator_delete(local_3d8.str._M_dataplus._M_p);
          this_02._M_pi =
               local_3d8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
LAB_00184995:
        if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
        }
      }
      else {
        pcVar11 = "int2";
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          load<embree::Vec2<int>>((XMLLoader *)local_7a0,(Ref<embree::XML> *)pcVar11);
          local_440.type = INT2;
          local_440.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_440.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          paVar5 = &local_440.str.field_2;
          local_440.str._M_string_length = 0;
          local_440.str.field_2._M_local_buf[0] = '\0';
          local_440.field_1._0_8_ = local_7a0;
          local_440.str._M_dataplus._M_p = (pointer)paVar5;
          Parms::add(__return_storage_ptr__,&local_878,&local_440);
          this_02._M_pi =
               local_440.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440.str._M_dataplus._M_p != paVar5) {
            operator_delete(local_440.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_440.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        pcVar11 = "int3";
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          load<embree::Vec3<int>>((XMLLoader *)local_7b0,(Ref<embree::XML> *)pcVar11);
          local_6b0.type = INT3;
          local_6b0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_6b0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6b0.str._M_string_length = 0;
          local_6b0.str.field_2._M_local_buf[0] = '\0';
          local_6b0.field_1._0_8_ = local_7b0._0_8_;
          local_6b0.field_1.i[2] = local_7b0._8_4_;
          local_6b0.str._M_dataplus._M_p = (pointer)paVar4;
          Parms::add(__return_storage_ptr__,&local_878,&local_6b0);
          this_02._M_pi =
               local_6b0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6b0.str._M_dataplus._M_p != paVar4) {
            operator_delete(local_6b0.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_6b0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        pcVar11 = "int4";
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          load<embree::Vec4<int>>((XMLLoader *)&local_748,(Ref<embree::XML> *)pcVar11);
          local_4a8.type = INT4;
          local_4a8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_4a8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_4a8.str._M_string_length = 0;
          local_4a8.str.field_2._M_local_buf[0] = '\0';
          local_4a8.field_1._0_8_ = local_748._M_allocated_capacity;
          local_4a8.field_1._8_8_ = local_748._8_8_;
          local_4a8.str._M_dataplus._M_p = (pointer)paVar3;
          Parms::add(__return_storage_ptr__,&local_878,&local_4a8);
          this_02._M_pi =
               local_4a8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8.str._M_dataplus._M_p != paVar3) {
            operator_delete(local_4a8.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_4a8.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        pXVar12 = (XMLLoader *)psVar2;
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          local_510.field_1.f[0] = load<float>(pXVar12,&local_880);
          local_510.type = FLOAT1;
          local_510.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_510.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_510.str._M_string_length = 0;
          local_510.str.field_2._M_local_buf[0] = '\0';
          local_510.str._M_dataplus._M_p = (pointer)paVar9;
          Parms::add(__return_storage_ptr__,&local_878,&local_510);
          this_02._M_pi =
               local_510.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510.str._M_dataplus._M_p != paVar9) {
            operator_delete(local_510.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_510.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        pcVar11 = "float2";
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          load<embree::Vec2<float>>((XMLLoader *)(local_7c0 + 8),(Ref<embree::XML> *)pcVar11);
          local_578.type = FLOAT2;
          local_578.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_578.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          paVar5 = &local_578.str.field_2;
          local_578.str._M_string_length = 0;
          local_578.str.field_2._M_local_buf[0] = '\0';
          local_578.field_1._0_8_ = local_7c0._8_8_;
          local_578.str._M_dataplus._M_p = (pointer)paVar5;
          Parms::add(__return_storage_ptr__,&local_878,&local_578);
          this_02._M_pi =
               local_578.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578.str._M_dataplus._M_p != paVar5) {
            operator_delete(local_578.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_578.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        pcVar11 = "float3";
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          load<embree::Vec3<float>>((XMLLoader *)(local_7d0 + 8),(Ref<embree::XML> *)pcVar11);
          local_718.type = 0xb;
          local_718.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_718.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          paVar5 = &local_718.str.field_2;
          local_718.str._M_string_length = 0;
          local_718.str.field_2._M_local_buf[0] = '\0';
          local_718.field_1._0_8_ = local_7d0._8_8_;
          local_718.field_1.i[2] = local_7c0._0_4_;
          local_718.str._M_dataplus._M_p = (pointer)paVar5;
          Parms::add(__return_storage_ptr__,&local_878,&local_718);
          this_02._M_pi =
               local_718.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_718.str._M_dataplus._M_p != paVar5) {
            operator_delete(local_718.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_718.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        pcVar11 = "float4";
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          load<embree::Vec4<float>>((XMLLoader *)&local_758,(Ref<embree::XML> *)pcVar11);
          local_5e0.type = FLOAT4;
          local_5e0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_5e0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          paVar5 = &local_5e0.str.field_2;
          local_5e0.str._M_string_length = 0;
          local_5e0.str.field_2._M_local_buf[0] = '\0';
          local_5e0.field_1._0_8_ = local_758._M_allocated_capacity;
          local_5e0.field_1._8_8_ = local_758._8_8_;
          local_5e0.str._M_dataplus._M_p = (pointer)paVar5;
          Parms::add(__return_storage_ptr__,&local_878,&local_5e0);
          this_02._M_pi =
               local_5e0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e0.str._M_dataplus._M_p != paVar5) {
            operator_delete(local_5e0.str._M_dataplus._M_p);
            this_02._M_pi =
                 local_5e0.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
          }
          goto LAB_00184995;
        }
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          loadTextureParm((XMLLoader *)local_818,(Ref<embree::XML> *)local_818._16_8_);
          local_648.type = TEXTURE;
          local_648.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_818._0_8_;
          local_648.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._8_8_;
          paVar5 = &local_648.str.field_2;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_818._8_8_ + 8) = *(_Atomic_word *)(local_818._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_818._8_8_ + 8) = *(_Atomic_word *)(local_818._8_8_ + 8) + 1;
            }
          }
          local_648.str._M_string_length = 0;
          local_648.str.field_2._M_local_buf[0] = '\0';
          local_648.str._M_dataplus._M_p = (pointer)paVar5;
          Parms::add(__return_storage_ptr__,&local_878,&local_648);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648.str._M_dataplus._M_p != paVar5) {
            operator_delete(local_648.str._M_dataplus._M_p);
          }
          this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._8_8_;
          if (local_648.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_648.texture.
                       super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi);
            this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._8_8_;
          }
          goto LAB_00184995;
        }
        iVar6 = std::__cxx11::string::compare((char *)psVar2);
        if (iVar6 == 0) {
          local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_858 + 0x20),"type","");
          XML::parm((string *)local_858,this_00,(string *)(local_858 + 0x20));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_838._M_dataplus._M_p != &local_838.field_2) {
            operator_delete(local_838._M_dataplus._M_p);
          }
          pXVar12 = (XMLLoader *)local_858;
          iVar6 = std::__cxx11::string::compare((char *)local_858);
          if (iVar6 == 0) {
            local_98.field_1.i[0] = load<int>(pXVar12,&local_880);
            local_98.type = INT1;
            local_98.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            local_98.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_98.str._M_dataplus._M_p = (pointer)&local_98.str.field_2;
            local_98.str._M_string_length = 0;
            local_98.str.field_2._M_local_buf[0] = '\0';
            data = &local_98;
            Parms::add(__return_storage_ptr__,&local_878,data);
          }
          else {
            pcVar11 = "int2";
            iVar6 = std::__cxx11::string::compare((char *)local_858);
            if (iVar6 == 0) {
              load<embree::Vec2<int>>((XMLLoader *)local_7d0,(Ref<embree::XML> *)pcVar11);
              local_100.type = INT2;
              local_100.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              local_100.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_100.str._M_dataplus._M_p = (pointer)&local_100.str.field_2;
              local_100.str._M_string_length = 0;
              local_100.str.field_2._M_local_buf[0] = '\0';
              local_100.field_1._0_8_ = local_7d0._0_8_;
              data = &local_100;
              Parms::add(__return_storage_ptr__,&local_878,data);
            }
            else {
              pcVar11 = "int3";
              iVar6 = std::__cxx11::string::compare((char *)local_858);
              if (iVar6 == 0) {
                load<embree::Vec3<int>>((XMLLoader *)local_7e0,(Ref<embree::XML> *)pcVar11);
                local_308.type = INT3;
                local_308.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                local_308.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_308.str._M_dataplus._M_p = (pointer)&local_308.str.field_2;
                local_308.str._M_string_length = 0;
                local_308.str.field_2._M_local_buf[0] = '\0';
                local_308.field_1._0_8_ = local_7e0._0_8_;
                local_308.field_1.i[2] = local_7e0._8_4_;
                data = &local_308;
                Parms::add(__return_storage_ptr__,&local_878,data);
              }
              else {
                pcVar11 = "int4";
                iVar6 = std::__cxx11::string::compare((char *)local_858);
                if (iVar6 == 0) {
                  load<embree::Vec4<int>>((XMLLoader *)&local_768,(Ref<embree::XML> *)pcVar11);
                  local_168.type = INT4;
                  local_168.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_168.texture.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_168.str._M_dataplus._M_p = (pointer)&local_168.str.field_2;
                  local_168.str._M_string_length = 0;
                  local_168.str.field_2._M_local_buf[0] = '\0';
                  local_168.field_1._0_8_ = local_768._M_allocated_capacity;
                  local_168.field_1._8_8_ = local_768._8_8_;
                  data = &local_168;
                  Parms::add(__return_storage_ptr__,&local_878,data);
                }
                else {
                  pXVar12 = (XMLLoader *)local_858;
                  iVar6 = std::__cxx11::string::compare((char *)local_858);
                  if (iVar6 == 0) {
                    local_1d0.field_1.f[0] = load<float>(pXVar12,&local_880);
                    local_1d0.type = FLOAT1;
                    local_1d0.texture.
                    super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    local_1d0.texture.
                    super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_1d0.str._M_dataplus._M_p = (pointer)&local_1d0.str.field_2;
                    local_1d0.str._M_string_length = 0;
                    local_1d0.str.field_2._M_local_buf[0] = '\0';
                    data = &local_1d0;
                    Parms::add(__return_storage_ptr__,&local_878,data);
                  }
                  else {
                    pcVar11 = "float2";
                    iVar6 = std::__cxx11::string::compare((char *)local_858);
                    if (iVar6 == 0) {
                      load<embree::Vec2<float>>((XMLLoader *)local_7e8,(Ref<embree::XML> *)pcVar11);
                      local_238.type = FLOAT2;
                      local_238.texture.
                      super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)0x0;
                      local_238.texture.
                      super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_238.str._M_dataplus._M_p = (pointer)&local_238.str.field_2;
                      local_238.str._M_string_length = 0;
                      local_238.str.field_2._M_local_buf[0] = '\0';
                      local_238.field_1._0_8_ = local_7e8;
                      data = &local_238;
                      Parms::add(__return_storage_ptr__,&local_878,data);
                    }
                    else {
                      pcVar11 = "float3";
                      iVar6 = std::__cxx11::string::compare((char *)local_858);
                      if (iVar6 == 0) {
                        load<embree::Vec3<float>>
                                  ((XMLLoader *)(local_818 + 0x20),(Ref<embree::XML> *)pcVar11);
                        local_370.type = FLOAT3;
                        local_370.texture.
                        super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)0x0;
                        local_370.texture.
                        super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        local_370.str._M_dataplus._M_p = (pointer)&local_370.str.field_2;
                        local_370.str._M_string_length = 0;
                        local_370.str.field_2._M_local_buf[0] = '\0';
                        local_370.field_1._0_8_ = local_818._32_8_;
                        local_370.field_1.i[2] = local_7f0;
                        data = &local_370;
                        Parms::add(__return_storage_ptr__,&local_878,data);
                      }
                      else {
                        pcVar11 = "float4";
                        iVar6 = std::__cxx11::string::compare((char *)local_858);
                        if (iVar6 != 0) {
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          ParseLocation::str_abi_cxx11_(&local_738,&this_00->loc);
                          plVar8 = (long *)std::__cxx11::string::append((char *)&local_738);
                          local_798._0_8_ = *plVar8;
                          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(plVar8 + 2);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_798._0_8_ == paVar9) {
                            local_788._M_allocated_capacity = paVar9->_M_allocated_capacity;
                            local_788._8_8_ = plVar8[3];
                            local_798._0_8_ = &local_788;
                          }
                          else {
                            local_788._M_allocated_capacity = paVar9->_M_allocated_capacity;
                          }
                          local_798._8_8_ = plVar8[1];
                          *plVar8 = (long)paVar9;
                          plVar8[1] = 0;
                          *(undefined1 *)(plVar8 + 2) = 0;
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(local_858 + 0x20),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_798,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_858);
                          std::runtime_error::runtime_error(this_01,(string *)(local_858 + 0x20));
                          __cxa_throw(this_01,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        load<embree::Vec4<float>>
                                  ((XMLLoader *)&local_778,(Ref<embree::XML> *)pcVar11);
                        local_2a0.type = FLOAT4;
                        local_2a0.texture.
                        super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)0x0;
                        local_2a0.texture.
                        super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        local_2a0.str._M_dataplus._M_p = (pointer)&local_2a0.str.field_2;
                        local_2a0.str._M_string_length = 0;
                        local_2a0.str.field_2._M_local_buf[0] = '\0';
                        local_2a0.field_1._0_8_ = local_778._M_allocated_capacity;
                        local_2a0.field_1._8_8_ = local_778._8_8_;
                        data = &local_2a0;
                        Parms::add(__return_storage_ptr__,&local_878,data);
                      }
                    }
                  }
                }
              }
            }
          }
          Variant::~Variant(data);
          if ((undefined1 *)local_858._0_8_ != local_858 + 0x10) {
            operator_delete((void *)local_858._0_8_);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_878._M_dataplus._M_p != &local_878.field_2) {
        operator_delete(local_878._M_dataplus._M_p);
      }
      if (local_880.ptr != (XML *)0x0) {
        (*((local_880.ptr)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar10 = uVar10 + 1;
      pRVar7 = ((*(XML **)local_818._24_8_)->children).
               super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)((*(XML **)local_818._24_8_)->children).
                                    super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar7 >> 3))
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Parms XMLLoader::loadMaterialParms(const Ref<XML>& parms)
  {
    Parms material;
    for (size_t i=0; i<parms->size(); i++) 
    {
      Ref<XML> entry = parms->children[i];
      std::string name = entry->parm("name");
      if      (entry->name == "int"    ) { material.add(name, load<int>  (entry)); }
      else if (entry->name == "int2"   ) { material.add(name, load<Vec2i>(entry)); }
      else if (entry->name == "int3"   ) { material.add(name, load<Vec3i>(entry)); }
      else if (entry->name == "int4"   ) { material.add(name, load<Vec4i>(entry)); }
      else if (entry->name == "float"  ) { material.add(name, load<float>(entry)); }
      else if (entry->name == "float2" ) { material.add(name, load<Vec2f>(entry)); }
      else if (entry->name == "float3" ) { material.add(name, load<Vec3f>(entry)); }
      else if (entry->name == "float4" ) { material.add(name, load<Vec4f>(entry)); }
      else if (entry->name == "texture3d") { material.add(name, loadTextureParm(entry)); }
      else if (entry->name == "param") {
        const std::string type = entry->parm("type");
        if      (type ==  "int"   ) { material.add(name, load<int>  (entry)); }
        else if (type == "int2"   ) { material.add(name, load<Vec2i>(entry)); }
        else if (type == "int3"   ) { material.add(name, load<Vec3i>(entry)); }
        else if (type == "int4"   ) { material.add(name, load<Vec4i>(entry)); }
        else if (type == "float"  ) { material.add(name, load<float>(entry)); }
        else if (type == "float2" ) { material.add(name, load<Vec2f>(entry)); }
        else if (type == "float3" ) { material.add(name, load<Vec3f>(entry)); }
        else if (type == "float4" ) { material.add(name, load<Vec4f>(entry)); }
        else THROW_RUNTIME_ERROR(entry->loc.str()+": invalid param type: "+type);
      }
    }
    return material;
  }